

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cc
# Opt level: O2

Status * __thiscall
draco::Encoder::EncodeMeshToBuffer
          (Status *__return_storage_ptr__,Encoder *this,Mesh *m,EncoderBuffer *out_buffer)

{
  ExpertEncoder encoder;
  ExpertEncoder EStack_168;
  EncoderOptions local_b0;
  
  ExpertEncoder::ExpertEncoder(&EStack_168,m);
  CreateExpertEncoderOptions(&local_b0,this,&m->super_PointCloud);
  ExpertEncoder::Reset(&EStack_168,&local_b0);
  EncoderOptionsBase<int>::~EncoderOptionsBase(&local_b0);
  ExpertEncoder::EncodeToBuffer(__return_storage_ptr__,&EStack_168,out_buffer);
  if (__return_storage_ptr__->code_ == OK) {
    std::__cxx11::string::~string((string *)&__return_storage_ptr__->error_msg_);
    (this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>).
    num_encoded_points_ =
         EStack_168.super_EncoderBase<draco::EncoderOptionsBase<int>_>.num_encoded_points_;
    (this->super_EncoderBase<draco::EncoderOptionsBase<draco::GeometryAttribute::Type>_>).
    num_encoded_faces_ =
         EStack_168.super_EncoderBase<draco::EncoderOptionsBase<int>_>.num_encoded_faces_;
    __return_storage_ptr__->code_ = OK;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    (__return_storage_ptr__->error_msg_)._M_string_length = 0;
    (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
  }
  EncoderBase<draco::EncoderOptionsBase<int>_>::~EncoderBase
            (&EStack_168.super_EncoderBase<draco::EncoderOptionsBase<int>_>);
  return __return_storage_ptr__;
}

Assistant:

Status Encoder::EncodeMeshToBuffer(const Mesh &m, EncoderBuffer *out_buffer) {
  ExpertEncoder encoder(m);
  encoder.Reset(CreateExpertEncoderOptions(m));
  DRACO_RETURN_IF_ERROR(encoder.EncodeToBuffer(out_buffer));
  set_num_encoded_points(encoder.num_encoded_points());
  set_num_encoded_faces(encoder.num_encoded_faces());
  return OkStatus();
}